

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O0

uint32_t icu_63::setWeightByte(uint32_t weight,int32_t idx,uint32_t byte)

{
  byte bVar1;
  undefined4 local_18;
  uint32_t mask;
  uint32_t byte_local;
  int32_t idx_local;
  uint32_t weight_local;
  
  if (idx * 8 < 0x20) {
    local_18 = 0xffffffff >> ((byte)(idx * 8) & 0x1f);
  }
  else {
    local_18 = 0;
  }
  bVar1 = (char)idx * -8 + 0x20;
  return weight & (-0x100 << (bVar1 & 0x1f) | local_18) | byte << (bVar1 & 0x1f);
}

Assistant:

static inline uint32_t
setWeightByte(uint32_t weight, int32_t idx, uint32_t byte) {
    uint32_t mask; /* 0xffffffff except a 00 "hole" for the index-th byte */

    idx*=8;
    if(idx<32) {
        mask=((uint32_t)0xffffffff)>>idx;
    } else {
        // Do not use uint32_t>>32 because on some platforms that does not shift at all
        // while we need it to become 0.
        // PowerPC: 0xffffffff>>32 = 0           (wanted)
        // x86:     0xffffffff>>32 = 0xffffffff  (not wanted)
        //
        // ANSI C99 6.5.7 Bitwise shift operators:
        // "If the value of the right operand is negative
        // or is greater than or equal to the width of the promoted left operand,
        // the behavior is undefined."
        mask=0;
    }
    idx=32-idx;
    mask|=0xffffff00<<idx;
    return (uint32_t)((weight&mask)|(byte<<idx));
}